

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbf.cpp
# Opt level: O1

bool SignalsOptInRBF(CTransaction *tx)

{
  uint uVar1;
  pointer pCVar2;
  pointer pCVar3;
  pointer pCVar4;
  long in_FS_OFFSET;
  bool bVar5;
  
  pCVar2 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar3 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bVar5 = pCVar2 != pCVar3;
  if (bVar5) {
    uVar1 = pCVar2->nSequence;
    while (0xfffffffd < uVar1) {
      pCVar4 = pCVar2 + 1;
      bVar5 = pCVar4 != pCVar3;
      if (pCVar4 == pCVar3) break;
      uVar1 = pCVar2[1].nSequence;
      pCVar2 = pCVar4;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool SignalsOptInRBF(const CTransaction &tx)
{
    for (const CTxIn &txin : tx.vin) {
        if (txin.nSequence <= MAX_BIP125_RBF_SEQUENCE) {
            return true;
        }
    }
    return false;
}